

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Woop<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  Geometry *pGVar4;
  Geometry *pGVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  byte bVar12;
  int iVar13;
  uint uVar14;
  ulong uVar16;
  undefined4 uVar17;
  ulong uVar18;
  long lVar19;
  Geometry *pGVar20;
  Geometry *pGVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined8 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_26a4;
  undefined1 local_26a0 [16];
  long local_2690;
  ulong local_2688;
  ulong local_2680;
  RayQueryContext *local_2678;
  undefined1 local_2670 [16];
  Scene *local_2658;
  long local_2650;
  ulong local_2648;
  ulong local_2640;
  ulong local_2638;
  RTCFilterFunctionNArguments local_2630;
  float local_2600;
  undefined4 local_25fc;
  undefined4 local_25f8;
  float local_25f4;
  float local_25f0;
  undefined4 local_25ec;
  uint local_25e8;
  uint local_25e4;
  uint local_25e0;
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [32];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  float local_2530 [4];
  float local_2520 [4];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [2] [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [16];
  float local_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar15;
  uint uVar56;
  undefined1 auVar72 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2678 = context;
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar31 = vandps_avx((undefined1  [16])aVar2,auVar31);
    auVar36 = vshufps_avx(auVar31,auVar31,0xf5);
    auVar60 = vshufps_avx(auVar31,auVar31,0x4e);
    auVar37 = vmaxss_avx(auVar31,auVar36);
    uVar14 = 2;
    if (auVar60._0_4_ < auVar37._0_4_) {
      uVar14 = (uint)(auVar31._0_4_ <= auVar36._0_4_);
    }
    uVar56 = uVar14 - 2;
    if (uVar14 + 1 < 3) {
      uVar56 = uVar14 + 1;
    }
    uVar3 = uVar56 + 1;
    if (uVar56 + 1 == 3) {
      uVar3 = 0;
    }
    uVar24 = (ulong)uVar14;
    fVar1 = (float)ray->instID[uVar24 - 0xf];
    uVar14 = uVar56;
    if (fVar1 < 0.0) {
      uVar14 = uVar3;
    }
    uVar26 = (ulong)uVar14;
    if (fVar1 < 0.0) {
      uVar3 = uVar56;
    }
    uVar22 = (ulong)uVar3;
    auVar36 = ZEXT416((uint)fVar1);
    auVar37 = vrcpss_avx(auVar36,auVar36);
    auVar36 = vfnmadd213ss_fma(auVar36,auVar37,ZEXT416(0x40000000));
    uVar14 = ray->instID[uVar26 - 0x13];
    auVar68 = ZEXT1664(CONCAT412(uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))));
    local_2470 = auVar37._0_4_ * auVar36._0_4_;
    fVar1 = local_2470 * (float)ray->instID[uVar22 - 0xf];
    uVar14 = ray->instID[uVar22 - 0x13];
    auVar69 = ZEXT1664(CONCAT412(uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))));
    local_2450 = local_2470 * (float)ray->instID[uVar26 - 0xf];
    pauVar29 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar37 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar36 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar60._8_4_ = 0x219392ef;
    auVar60._0_8_ = 0x219392ef219392ef;
    auVar60._12_4_ = 0x219392ef;
    auVar31 = vcmpps_avx(auVar31,auVar60,1);
    auVar31 = vblendvps_avx((undefined1  [16])aVar2,auVar60,auVar31);
    uVar14 = ray->instID[uVar24 - 0x13];
    auVar70 = ZEXT1664(CONCAT412(uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))));
    auVar60 = vrcpps_avx(auVar31);
    auVar71._8_4_ = 0x3f800000;
    auVar71._0_8_ = 0x3f8000003f800000;
    auVar71._12_4_ = 0x3f800000;
    auVar72 = ZEXT1664(auVar71);
    auVar31 = vfnmadd213ps_fma(auVar31,auVar60,auVar71);
    auVar43 = vfmadd132ps_fma(auVar31,auVar60,auVar60);
    fVar52 = auVar43._0_4_;
    local_23c0._4_4_ = fVar52;
    local_23c0._0_4_ = fVar52;
    local_23c0._8_4_ = fVar52;
    local_23c0._12_4_ = fVar52;
    local_23c0._16_4_ = fVar52;
    local_23c0._20_4_ = fVar52;
    local_23c0._24_4_ = fVar52;
    local_23c0._28_4_ = fVar52;
    auVar66 = ZEXT3264(local_23c0);
    auVar31 = vmovshdup_avx(auVar43);
    uVar57 = auVar31._0_8_;
    local_23e0._8_8_ = uVar57;
    local_23e0._0_8_ = uVar57;
    local_23e0._16_8_ = uVar57;
    local_23e0._24_8_ = uVar57;
    auVar67 = ZEXT3264(local_23e0);
    auVar60 = vshufpd_avx(auVar43,auVar43,1);
    auVar71 = vshufps_avx(auVar43,auVar43,0xaa);
    auVar53._0_4_ = fVar52 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar53._4_4_ = auVar43._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar53._8_4_ = auVar43._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar53._12_4_ = auVar43._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    local_2638 = (ulong)(fVar52 < 0.0) << 5;
    local_2400._0_8_ = auVar71._0_8_;
    local_2400._8_8_ = local_2400._0_8_;
    local_2400._16_8_ = local_2400._0_8_;
    local_2400._24_8_ = local_2400._0_8_;
    auVar64 = ZEXT3264(local_2400);
    uVar27 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x40;
    auVar31 = vmovshdup_avx(auVar53);
    auVar71 = vshufps_avx(auVar53,auVar53,0xaa);
    uVar28 = (ulong)(auVar60._0_4_ < 0.0) << 5 | 0x80;
    local_2648 = local_2638 ^ 0x20;
    local_2640 = uVar27;
    uVar17 = auVar36._0_4_;
    auVar35 = ZEXT3264(CONCAT428(uVar17,CONCAT424(uVar17,CONCAT420(uVar17,CONCAT416(uVar17,CONCAT412
                                                  (uVar17,CONCAT48(uVar17,CONCAT44(uVar17,uVar17))))
                                                  ))));
    uVar18 = CONCAT44(auVar53._0_4_,auVar53._0_4_);
    local_2420._0_8_ = uVar18 ^ 0x8000000080000000;
    local_2420._8_4_ = -auVar53._0_4_;
    local_2420._12_4_ = -auVar53._0_4_;
    local_2420._16_4_ = -auVar53._0_4_;
    local_2420._20_4_ = -auVar53._0_4_;
    local_2420._24_4_ = -auVar53._0_4_;
    local_2420._28_4_ = -auVar53._0_4_;
    auVar59 = ZEXT3264(local_2420);
    uVar14 = auVar31._0_4_;
    uVar56 = auVar31._4_4_;
    local_2440._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
    local_2440._8_4_ = uVar14 ^ 0x80000000;
    local_2440._12_4_ = uVar56 ^ 0x80000000;
    local_2440._16_4_ = uVar14 ^ 0x80000000;
    local_2440._20_4_ = uVar56 ^ 0x80000000;
    local_2440._24_4_ = uVar14 ^ 0x80000000;
    local_2440._28_4_ = uVar56 ^ 0x80000000;
    auVar62 = ZEXT3264(local_2440);
    uVar14 = auVar71._0_4_;
    uVar56 = auVar71._4_4_;
    local_24a0._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
    local_24a0._8_4_ = uVar14 ^ 0x80000000;
    local_24a0._12_4_ = uVar56 ^ 0x80000000;
    local_24a0._16_4_ = uVar14 ^ 0x80000000;
    local_24a0._20_4_ = uVar56 ^ 0x80000000;
    local_24a0._24_4_ = uVar14 ^ 0x80000000;
    local_24a0._28_4_ = uVar56 ^ 0x80000000;
    auVar55 = ZEXT3264(local_24a0);
    local_24c0._0_4_ = auVar37._0_4_;
    local_24c0._4_4_ = local_24c0._0_4_;
    local_24c0._8_4_ = local_24c0._0_4_;
    local_24c0._12_4_ = local_24c0._0_4_;
    local_24c0._16_4_ = local_24c0._0_4_;
    local_24c0._20_4_ = local_24c0._0_4_;
    local_24c0._24_4_ = local_24c0._0_4_;
    local_24c0._28_4_ = local_24c0._0_4_;
    auVar49 = ZEXT3264(local_24c0);
    local_2590 = mm_lookupmask_ps._240_16_;
    fStack_244c = local_2450;
    fStack_2448 = local_2450;
    fStack_2444 = local_2450;
    local_2460._4_4_ = fVar1;
    local_2460._0_4_ = fVar1;
    local_2460._8_4_ = fVar1;
    local_2460._12_4_ = fVar1;
    fStack_246c = local_2470;
    fStack_2468 = local_2470;
    fStack_2464 = local_2470;
LAB_01513ce1:
    if (pauVar29 != (undefined1 (*) [16])&local_23a0) {
      pauVar23 = pauVar29 + -1;
      pauVar29 = pauVar29 + -1;
      if (*(float *)(*pauVar23 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar18 = *(ulong *)*pauVar29;
        while ((uVar18 & 8) == 0) {
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + local_2638),
                                    auVar59._0_32_,auVar66._0_32_);
          auVar37 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + local_2640),
                                    auVar62._0_32_,auVar67._0_32_);
          auVar9 = vpmaxsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar37));
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar28),auVar55._0_32_,
                                    auVar64._0_32_);
          auVar10 = vpmaxsd_avx2(ZEXT1632(auVar31),auVar49._0_32_);
          local_2580 = vpmaxsd_avx2(auVar9,auVar10);
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + local_2648),
                                    auVar59._0_32_,auVar66._0_32_);
          auVar37 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar27 ^ 0x20)),
                                    auVar62._0_32_,auVar67._0_32_);
          auVar9 = vpminsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar37));
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar28 ^ 0x20)),
                                    auVar55._0_32_,auVar64._0_32_);
          auVar10 = vpminsd_avx2(ZEXT1632(auVar31),auVar35._0_32_);
          auVar9 = vpminsd_avx2(auVar9,auVar10);
          auVar9 = vpcmpgtd_avx2(local_2580,auVar9);
          iVar13 = vmovmskps_avx(auVar9);
          if (iVar13 == 0xff) goto LAB_01513ce1;
          bVar12 = ~(byte)iVar13;
          uVar30 = uVar18 & 0xfffffffffffffff0;
          lVar19 = 0;
          for (uVar18 = (ulong)bVar12; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
          {
            lVar19 = lVar19 + 1;
          }
          uVar18 = *(ulong *)(uVar30 + lVar19 * 8);
          uVar14 = bVar12 - 1 & (uint)bVar12;
          uVar15 = (ulong)uVar14;
          if (uVar14 != 0) {
            uVar56 = *(uint *)(local_2580 + lVar19 * 4);
            lVar19 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar19 = lVar19 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar16 = (ulong)uVar14;
            uVar15 = *(ulong *)(uVar30 + lVar19 * 8);
            uVar3 = *(uint *)(local_2580 + lVar19 * 4);
            if (uVar14 == 0) {
              if (uVar56 < uVar3) {
                *(ulong *)*pauVar29 = uVar15;
                *(uint *)(*pauVar29 + 8) = uVar3;
                pauVar29 = pauVar29 + 1;
              }
              else {
                *(ulong *)*pauVar29 = uVar18;
                *(uint *)(*pauVar29 + 8) = uVar56;
                pauVar29 = pauVar29 + 1;
                uVar18 = uVar15;
              }
            }
            else {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar18;
              auVar31 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar56));
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar15;
              auVar37 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
              lVar19 = 0;
              for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar19 = lVar19 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              uVar18 = (ulong)uVar14;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)(uVar30 + lVar19 * 8);
              auVar60 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2580 + lVar19 * 4)));
              auVar36 = vpcmpgtd_avx(auVar37,auVar31);
              if (uVar14 == 0) {
                auVar71 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar37,auVar31,auVar71);
                auVar31 = vblendvps_avx(auVar31,auVar37,auVar71);
                auVar37 = vpcmpgtd_avx(auVar60,auVar36);
                auVar71 = vpshufd_avx(auVar37,0xaa);
                auVar37 = vblendvps_avx(auVar60,auVar36,auVar71);
                auVar36 = vblendvps_avx(auVar36,auVar60,auVar71);
                auVar60 = vpcmpgtd_avx(auVar36,auVar31);
                auVar71 = vpshufd_avx(auVar60,0xaa);
                auVar60 = vblendvps_avx(auVar36,auVar31,auVar71);
                auVar31 = vblendvps_avx(auVar31,auVar36,auVar71);
                *pauVar29 = auVar31;
                pauVar29[1] = auVar60;
                uVar18 = auVar37._0_8_;
                pauVar23 = pauVar29 + 2;
              }
              else {
                lVar19 = 0;
                for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar19 = lVar19 + 1;
                }
                uVar14 = uVar14 - 1 & uVar14;
                uVar18 = (ulong)uVar14;
                auVar50._8_8_ = 0;
                auVar50._0_8_ = *(ulong *)(uVar30 + lVar19 * 8);
                auVar71 = vpunpcklqdq_avx(auVar50,ZEXT416(*(uint *)(local_2580 + lVar19 * 4)));
                if (uVar14 == 0) {
                  auVar43 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar37,auVar31,auVar43);
                  auVar31 = vblendvps_avx(auVar31,auVar37,auVar43);
                  auVar37 = vpcmpgtd_avx(auVar71,auVar60);
                  auVar43 = vpshufd_avx(auVar37,0xaa);
                  auVar37 = vblendvps_avx(auVar71,auVar60,auVar43);
                  auVar60 = vblendvps_avx(auVar60,auVar71,auVar43);
                  auVar71 = vpcmpgtd_avx(auVar60,auVar31);
                  auVar43 = vpshufd_avx(auVar71,0xaa);
                  auVar71 = vblendvps_avx(auVar60,auVar31,auVar43);
                  auVar31 = vblendvps_avx(auVar31,auVar60,auVar43);
                  auVar60 = vpcmpgtd_avx(auVar37,auVar36);
                  auVar43 = vpshufd_avx(auVar60,0xaa);
                  auVar60 = vblendvps_avx(auVar37,auVar36,auVar43);
                  auVar37 = vblendvps_avx(auVar36,auVar37,auVar43);
                  auVar36 = vpcmpgtd_avx(auVar71,auVar37);
                  auVar43 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar71,auVar37,auVar43);
                  auVar37 = vblendvps_avx(auVar37,auVar71,auVar43);
                  *pauVar29 = auVar31;
                  pauVar29[1] = auVar37;
                  pauVar29[2] = auVar36;
                  uVar18 = auVar60._0_8_;
                  pauVar23 = pauVar29 + 3;
                }
                else {
                  *pauVar29 = auVar31;
                  pauVar29[1] = auVar37;
                  pauVar29[2] = auVar60;
                  pauVar23 = pauVar29 + 3;
                  pauVar29[3] = auVar71;
                  do {
                    lVar19 = 0;
                    for (uVar15 = uVar18; (uVar15 & 1) == 0;
                        uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                      lVar19 = lVar19 + 1;
                    }
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = *(ulong *)(uVar30 + lVar19 * 8);
                    auVar31 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_2580 + lVar19 * 4)));
                    pauVar23[1] = auVar31;
                    pauVar23 = pauVar23 + 1;
                    uVar18 = uVar18 - 1 & uVar18;
                  } while (uVar18 != 0);
                  lVar19 = 0;
                  while (pauVar23 != pauVar29) {
                    auVar31 = pauVar29[1];
                    uVar14 = vextractps_avx(auVar31,2);
                    for (lVar25 = 0x10;
                        (lVar19 != lVar25 && (*(uint *)(pauVar29[-1] + lVar25 + 8) < uVar14));
                        lVar25 = lVar25 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar29 + lVar25) =
                           *(undefined1 (*) [16])(pauVar29[-1] + lVar25);
                    }
                    *(undefined1 (*) [16])(*pauVar29 + lVar25) = auVar31;
                    lVar19 = lVar19 + -0x10;
                    pauVar29 = pauVar29 + 1;
                  }
                  uVar18 = *(ulong *)*pauVar23;
                }
                auVar55 = ZEXT3264(local_24a0);
              }
              auVar49 = ZEXT3264(local_24c0);
              pauVar29 = pauVar23;
            }
          }
        }
        lVar19 = (ulong)((uint)uVar18 & 0xf) - 8;
        for (local_2650 = 0; local_2650 != lVar19; local_2650 = local_2650 + 1) {
          pauVar23 = (undefined1 (*) [16])(local_2650 * 0xb0 + (uVar18 & 0xfffffffffffffff0));
          auVar53 = auVar68._0_16_;
          auVar31 = vsubps_avx(pauVar23[uVar26],auVar53);
          auVar50 = auVar69._0_16_;
          auVar37 = vsubps_avx(pauVar23[uVar22],auVar50);
          auVar38 = auVar70._0_16_;
          auVar60 = vsubps_avx(pauVar23[uVar24],auVar38);
          auVar36 = vsubps_avx(pauVar23[uVar26 + 3],auVar53);
          auVar71 = vsubps_avx(pauVar23[uVar22 + 3],auVar50);
          auVar43 = vsubps_avx(pauVar23[uVar24 + 3],auVar38);
          auVar53 = vsubps_avx(pauVar23[uVar26 + 6],auVar53);
          auVar50 = vsubps_avx(pauVar23[uVar22 + 6],auVar50);
          auVar38 = vsubps_avx(pauVar23[uVar24 + 6],auVar38);
          auVar11._4_4_ = fStack_244c;
          auVar11._0_4_ = local_2450;
          auVar11._8_4_ = fStack_2448;
          auVar11._12_4_ = fStack_2444;
          auVar31 = vfnmadd231ps_fma(auVar31,auVar60,auVar11);
          auVar37 = vfnmadd231ps_fma(auVar37,auVar60,local_2460);
          auVar36 = vfnmadd231ps_fma(auVar36,auVar43,auVar11);
          auVar71 = vfnmadd231ps_fma(auVar71,auVar43,local_2460);
          auVar53 = vfnmadd231ps_fma(auVar53,auVar38,auVar11);
          auVar50 = vfnmadd231ps_fma(auVar50,auVar38,local_2460);
          auVar32._0_4_ = auVar71._0_4_ * auVar53._0_4_;
          auVar32._4_4_ = auVar71._4_4_ * auVar53._4_4_;
          auVar32._8_4_ = auVar71._8_4_ * auVar53._8_4_;
          auVar32._12_4_ = auVar71._12_4_ * auVar53._12_4_;
          auVar39._0_4_ = auVar36._0_4_ * auVar50._0_4_;
          auVar39._4_4_ = auVar36._4_4_ * auVar50._4_4_;
          auVar39._8_4_ = auVar36._8_4_ * auVar50._8_4_;
          auVar39._12_4_ = auVar36._12_4_ * auVar50._12_4_;
          auVar41._0_4_ = auVar31._0_4_ * auVar50._0_4_;
          auVar41._4_4_ = auVar31._4_4_ * auVar50._4_4_;
          auVar41._8_4_ = auVar31._8_4_ * auVar50._8_4_;
          auVar41._12_4_ = auVar31._12_4_ * auVar50._12_4_;
          auVar58._0_4_ = auVar37._0_4_ * auVar53._0_4_;
          auVar58._4_4_ = auVar37._4_4_ * auVar53._4_4_;
          auVar58._8_4_ = auVar37._8_4_ * auVar53._8_4_;
          auVar58._12_4_ = auVar37._12_4_ * auVar53._12_4_;
          auVar61._0_4_ = auVar37._0_4_ * auVar36._0_4_;
          auVar61._4_4_ = auVar37._4_4_ * auVar36._4_4_;
          auVar61._8_4_ = auVar37._8_4_ * auVar36._8_4_;
          auVar61._12_4_ = auVar37._12_4_ * auVar36._12_4_;
          auVar63._0_4_ = auVar71._0_4_ * auVar31._0_4_;
          auVar63._4_4_ = auVar71._4_4_ * auVar31._4_4_;
          auVar63._8_4_ = auVar71._8_4_ * auVar31._8_4_;
          auVar63._12_4_ = auVar71._12_4_ * auVar31._12_4_;
          auVar37 = vcmpps_avx(auVar32,auVar39,5);
          auVar31 = vcmpps_avx(auVar41,auVar58,5);
          auVar36 = vcmpps_avx(auVar61,auVar63,5);
          auVar31 = vandps_avx(auVar31,auVar36);
          auVar31 = vandps_avx(auVar31,auVar37);
          auVar37 = vcmpps_avx(auVar41,auVar58,2);
          auVar36 = vcmpps_avx(auVar61,auVar63,2);
          auVar37 = vandps_avx(auVar37,auVar36);
          auVar36 = vcmpps_avx(auVar32,auVar39,2);
          auVar37 = vandps_avx(auVar37,auVar36);
          auVar31 = vorps_avx(auVar37,auVar31);
          auVar37 = local_2590 & auVar31;
          if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar37[0xf] < '\0') {
            auVar31 = vandps_avx(auVar31,local_2590);
            local_2580._0_16_ = vsubps_avx(auVar32,auVar39);
            local_2580._16_16_ = vsubps_avx(auVar41,auVar58);
            auVar71 = vsubps_avx(auVar61,auVar63);
            auVar42._0_4_ = auVar71._0_4_ + local_2580._0_4_ + local_2580._16_4_;
            auVar42._4_4_ = auVar71._4_4_ + local_2580._4_4_ + local_2580._20_4_;
            auVar42._8_4_ = auVar71._8_4_ + local_2580._8_4_ + local_2580._24_4_;
            auVar42._12_4_ = auVar71._12_4_ + local_2580._12_4_ + local_2580._28_4_;
            auVar37 = vcmpps_avx(auVar42,_DAT_01f45a50,4);
            auVar36 = vrcpps_avx(auVar42);
            auVar53 = vfnmadd213ps_fma(auVar42,auVar36,auVar72._0_16_);
            local_2550 = vfmadd132ps_fma(auVar53,auVar36,auVar36);
            auVar44._0_4_ = local_2470 * auVar60._0_4_;
            auVar44._4_4_ = fStack_246c * auVar60._4_4_;
            auVar44._8_4_ = fStack_2468 * auVar60._8_4_;
            auVar44._12_4_ = fStack_2464 * auVar60._12_4_;
            auVar46._0_4_ = local_2470 * auVar43._0_4_;
            auVar46._4_4_ = fStack_246c * auVar43._4_4_;
            auVar46._8_4_ = fStack_2468 * auVar43._8_4_;
            auVar46._12_4_ = fStack_2464 * auVar43._12_4_;
            auVar51._0_4_ = auVar71._0_4_ * local_2470 * auVar38._0_4_;
            auVar51._4_4_ = auVar71._4_4_ * fStack_246c * auVar38._4_4_;
            auVar51._8_4_ = auVar71._8_4_ * fStack_2468 * auVar38._8_4_;
            auVar51._12_4_ = auVar71._12_4_ * fStack_2464 * auVar38._12_4_;
            auVar36 = vfmadd231ps_fma(auVar51,local_2580._16_16_,auVar46);
            auVar36 = vfmadd231ps_fma(auVar36,local_2580._0_16_,auVar44);
            fVar52 = local_2550._0_4_;
            local_2560._0_4_ = auVar36._0_4_ * fVar52;
            fVar6 = local_2550._4_4_;
            local_2560._4_4_ = auVar36._4_4_ * fVar6;
            fVar7 = local_2550._8_4_;
            local_2560._8_4_ = auVar36._8_4_ * fVar7;
            fVar8 = local_2550._12_4_;
            local_2560._12_4_ = auVar36._12_4_ * fVar8;
            auVar35 = ZEXT1664(local_2560);
            uVar17 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar45._4_4_ = uVar17;
            auVar45._0_4_ = uVar17;
            auVar45._8_4_ = uVar17;
            auVar45._12_4_ = uVar17;
            auVar36 = vcmpps_avx(auVar45,local_2560,1);
            auVar37 = vandps_avx(auVar37,auVar36);
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar47._4_4_ = fVar1;
            auVar47._0_4_ = fVar1;
            auVar47._8_4_ = fVar1;
            auVar47._12_4_ = fVar1;
            auVar36 = vcmpps_avx(local_2560,auVar47,2);
            auVar37 = vandps_avx(auVar37,auVar36);
            auVar36 = auVar31 & auVar37;
            if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar36[0xf] < '\0') {
              local_2670._0_4_ = (ray->super_RayK<1>).tfar;
              local_2670._4_4_ = (ray->super_RayK<1>).mask;
              local_2670._8_4_ = (ray->super_RayK<1>).id;
              local_2670._12_4_ = (ray->super_RayK<1>).flags;
              auVar31 = vandps_avx(auVar37,auVar31);
              auVar37 = vsubps_avx(pauVar23[6],*pauVar23);
              auVar36 = vsubps_avx(pauVar23[7],pauVar23[1]);
              auVar60 = vsubps_avx(*pauVar23,pauVar23[3]);
              auVar71 = vsubps_avx(pauVar23[1],pauVar23[4]);
              auVar43 = vsubps_avx(pauVar23[8],pauVar23[2]);
              auVar53 = vsubps_avx(pauVar23[2],pauVar23[5]);
              auVar65._0_4_ = auVar43._0_4_ * auVar71._0_4_;
              auVar65._4_4_ = auVar43._4_4_ * auVar71._4_4_;
              auVar65._8_4_ = auVar43._8_4_ * auVar71._8_4_;
              auVar65._12_4_ = auVar43._12_4_ * auVar71._12_4_;
              local_2500 = vfmsub231ps_fma(auVar65,auVar36,auVar53);
              auVar54._0_4_ = auVar53._0_4_ * auVar37._0_4_;
              auVar54._4_4_ = auVar53._4_4_ * auVar37._4_4_;
              auVar54._8_4_ = auVar53._8_4_ * auVar37._8_4_;
              auVar54._12_4_ = auVar53._12_4_ * auVar37._12_4_;
              local_24f0 = vfmsub231ps_fma(auVar54,auVar60,auVar43);
              auVar48._0_4_ = auVar36._0_4_ * auVar60._0_4_;
              auVar48._4_4_ = auVar36._4_4_ * auVar60._4_4_;
              auVar48._8_4_ = auVar36._8_4_ * auVar60._8_4_;
              auVar48._12_4_ = auVar36._12_4_ * auVar60._12_4_;
              local_24e0[0] = vfmsub231ps_fma(auVar48,auVar37,auVar71);
              local_2540 = auVar31;
              local_26a0 = auVar31;
              local_2510 = local_2560;
              local_2530[0] = local_2580._0_4_ * fVar52;
              local_2530[1] = local_2580._4_4_ * fVar6;
              local_2530[2] = local_2580._8_4_ * fVar7;
              local_2530[3] = local_2580._12_4_ * fVar8;
              local_2520[0] = fVar52 * local_2580._16_4_;
              local_2520[1] = fVar6 * local_2580._20_4_;
              local_2520[2] = fVar7 * local_2580._24_4_;
              local_2520[3] = fVar8 * local_2580._28_4_;
              auVar33._8_4_ = 0x7f800000;
              auVar33._0_8_ = 0x7f8000007f800000;
              auVar33._12_4_ = 0x7f800000;
              auVar37 = vblendvps_avx(auVar33,local_2560,auVar31);
              auVar36 = vshufps_avx(auVar37,auVar37,0xb1);
              auVar36 = vminps_avx(auVar36,auVar37);
              auVar60 = vshufpd_avx(auVar36,auVar36,1);
              auVar36 = vminps_avx(auVar60,auVar36);
              auVar37 = vcmpps_avx(auVar37,auVar36,0);
              auVar36 = auVar31 & auVar37;
              if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar36[0xf] < '\0') {
                auVar31 = vandps_avx(auVar37,auVar31);
              }
              uVar14 = vextractps_avx(local_2670,1);
              uVar17 = vmovmskps_avx(auVar31);
              pGVar20 = (Geometry *)0x0;
              for (uVar30 = CONCAT44((int)(uVar22 * 0x10 >> 0x20),uVar17); (uVar30 & 1) == 0;
                  uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                pGVar20 = (Geometry *)((long)&(pGVar20->super_RefCount)._vptr_RefCount + 1);
              }
              local_2658 = local_2678->scene;
              do {
                local_25c0 = auVar70._0_16_;
                local_25b0 = auVar69._0_16_;
                local_25a0 = auVar68._0_16_;
                local_25d0 = auVar35._0_16_;
                local_25e8 = *(uint *)(pauVar23[9] + (long)pGVar20 * 4);
                pGVar4 = (local_2658->geometries).items[local_25e8].ptr;
                if ((pGVar4->mask & uVar14) == 0) {
                  *(undefined4 *)(local_26a0 + (long)pGVar20 * 4) = 0;
                }
                else {
                  pGVar5 = (Geometry *)local_2678->args;
                  if (pGVar5->device == (Device *)0x0) {
                    local_2630.context = local_2678->user;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar1 = local_2530[(long)pGVar20];
                      fVar52 = local_2520[(long)pGVar20];
                      (ray->super_RayK<1>).tfar = *(float *)(local_2510 + (long)pGVar20 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_2500 + (long)pGVar20 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_24f0 + (long)pGVar20 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_24e0[0] + (long)pGVar20 * 4);
                      ray->u = fVar1;
                      ray->v = fVar52;
                      ray->primID = *(uint *)(pauVar23[10] + (long)pGVar20 * 4);
                      ray->geomID = local_25e8;
                      ray->instID[0] = (local_2630.context)->instID[0];
                      ray->instPrimID[0] = (local_2630.context)->instPrimID[0];
                      break;
                    }
                    local_2690 = lVar19;
                    local_2688 = uVar24;
                    local_2680 = uVar22;
                  }
                  else {
                    local_2690 = lVar19;
                    local_2688 = uVar24;
                    local_2680 = uVar22;
                    local_2630.context = local_2678->user;
                  }
                  local_2600 = *(float *)(local_2500 + (long)pGVar20 * 4);
                  local_25fc = *(undefined4 *)(local_24f0 + (long)pGVar20 * 4);
                  local_25f8 = *(undefined4 *)(local_24e0[0] + (long)pGVar20 * 4);
                  local_25f4 = local_2530[(long)pGVar20];
                  local_25f0 = local_2520[(long)pGVar20];
                  local_25ec = *(undefined4 *)(pauVar23[10] + (long)pGVar20 * 4);
                  local_25e4 = (local_2630.context)->instID[0];
                  local_25e0 = (local_2630.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_2510 + (long)pGVar20 * 4);
                  local_26a4 = -1;
                  local_2630.valid = &local_26a4;
                  pGVar21 = (Geometry *)pGVar4->userPtr;
                  local_2630.geometryUserPtr = pGVar21;
                  local_2630.ray = (RTCRayN *)ray;
                  local_2630.hit = (RTCHitN *)&local_2600;
                  local_2630.N = 1;
                  local_2690 = lVar19;
                  local_2688 = uVar24;
                  local_2680 = uVar22;
                  if (((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*pGVar4->intersectionFilterN)(&local_2630), *local_2630.valid != 0)) &&
                     ((pGVar5->device == (Device *)0x0 ||
                      (((pGVar21 = pGVar5, ((ulong)(pGVar5->super_RefCount)._vptr_RefCount & 2) == 0
                        && (pGVar21 = pGVar4, ((pGVar4->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*(code *)pGVar5->device)(&local_2630), *local_2630.valid != 0)))))) {
                    (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_2630.hit;
                    (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_2630.hit + 4);
                    (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_2630.hit + 8);
                    *(float *)((long)local_2630.ray + 0x3c) = *(float *)(local_2630.hit + 0xc);
                    *(float *)((long)local_2630.ray + 0x40) = *(float *)(local_2630.hit + 0x10);
                    *(float *)((long)local_2630.ray + 0x44) = *(float *)(local_2630.hit + 0x14);
                    *(float *)((long)local_2630.ray + 0x48) = *(float *)(local_2630.hit + 0x18);
                    *(float *)((long)local_2630.ray + 0x4c) = *(float *)(local_2630.hit + 0x1c);
                    pGVar21 = (Geometry *)0x0;
                    *(float *)((long)local_2630.ray + 0x50) = *(float *)(local_2630.hit + 0x20);
                  }
                  else {
                    (ray->super_RayK<1>).tfar = (float)local_2670._0_4_;
                  }
                  *(undefined4 *)(local_26a0 + (long)pGVar20 * 4) = 0;
                  fVar1 = (ray->super_RayK<1>).tfar;
                  auVar34._4_4_ = fVar1;
                  auVar34._0_4_ = fVar1;
                  auVar34._8_4_ = fVar1;
                  auVar34._12_4_ = fVar1;
                  auVar35 = ZEXT1664(local_25d0);
                  auVar31 = vcmpps_avx(local_25d0,auVar34,2);
                  local_26a0 = vandps_avx(auVar31,local_26a0);
                  local_2670._0_4_ = (ray->super_RayK<1>).tfar;
                  local_2670._4_4_ = (ray->super_RayK<1>).mask;
                  local_2670._8_4_ = (ray->super_RayK<1>).id;
                  local_2670._12_4_ = (ray->super_RayK<1>).flags;
                  uVar14 = vextractps_avx(local_2670,1);
                  auVar68 = ZEXT1664(local_25a0);
                  auVar69 = ZEXT1664(local_25b0);
                  auVar70 = ZEXT1664(local_25c0);
                  auVar72 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
                  pGVar20 = pGVar21;
                  uVar24 = local_2688;
                  lVar19 = local_2690;
                  uVar22 = local_2680;
                }
                if ((((local_26a0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_26a0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_26a0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_26a0[0xf]) break;
                auVar40._8_4_ = 0x7f800000;
                auVar40._0_8_ = 0x7f8000007f800000;
                auVar40._12_4_ = 0x7f800000;
                auVar31 = vblendvps_avx(auVar40,auVar35._0_16_,local_26a0);
                auVar37 = vshufps_avx(auVar31,auVar31,0xb1);
                auVar37 = vminps_avx(auVar37,auVar31);
                auVar36 = vshufpd_avx(auVar37,auVar37,1);
                auVar37 = vminps_avx(auVar36,auVar37);
                auVar37 = vcmpps_avx(auVar31,auVar37,0);
                auVar36 = local_26a0 & auVar37;
                auVar31 = local_26a0;
                if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar36[0xf] < '\0') {
                  auVar31 = vandps_avx(auVar37,local_26a0);
                }
                uVar30 = (ulong)pGVar20 >> 0x20;
                uVar17 = vmovmskps_avx(auVar31);
                pGVar20 = (Geometry *)0x0;
                for (uVar30 = CONCAT44((int)uVar30,uVar17); (uVar30 & 1) == 0;
                    uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                  pGVar20 = (Geometry *)((long)&(pGVar20->super_RefCount)._vptr_RefCount + 1);
                }
              } while( true );
            }
          }
          auVar66 = ZEXT3264(local_23c0);
          auVar67 = ZEXT3264(local_23e0);
          auVar64 = ZEXT3264(local_2400);
          auVar59 = ZEXT3264(local_2420);
          auVar62 = ZEXT3264(local_2440);
          auVar55 = ZEXT3264(local_24a0);
          auVar49 = ZEXT3264(local_24c0);
        }
        fVar1 = (ray->super_RayK<1>).tfar;
        auVar35 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412
                                                  (fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))))
        ;
      }
      goto LAB_01513ce1;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }